

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

void __thiscall HN::State::forceUpdate(State *this,ItemIds *toUpdate)

{
  ItemContainer *this_00;
  key_type *__k;
  pointer piVar1;
  undefined8 in_RAX;
  uint64_t uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  pointer piVar5;
  int id;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar2 = t_s();
  piVar1 = (toUpdate->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  this_00 = &this->items;
  __k = (key_type *)((long)&uStack_38 + 4);
  for (piVar5 = (toUpdate->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
    uStack_38 = CONCAT44(*piVar5,(undefined4)uStack_38);
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_HN::Item>,_std::_Select1st<std::pair<const_int,_HN::Item>_>,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
            ::find(&this_00->_M_t,__k);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->items)._M_t._M_impl.super__Rb_tree_header) {
      pmVar4 = std::
               map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
               ::operator[](this_00,__k);
      if (0x3c < uVar2 - pmVar4->lastForceUpdate_s) {
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,__k);
        pmVar4->needUpdate = true;
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,__k);
        pmVar4->needRequest = true;
        pmVar4 = std::
                 map<int,_HN::Item,_std::less<int>,_std::allocator<std::pair<const_int,_HN::Item>_>_>
                 ::operator[](this_00,__k);
        pmVar4->lastForceUpdate_s = uVar2;
      }
    }
  }
  return;
}

Assistant:

void State::forceUpdate(const ItemIds & toUpdate) {
        auto tNow_s = t_s();
        for (auto id : toUpdate) {
            if (items.find(id) == items.end()) continue;
            if (tNow_s - items[id].lastForceUpdate_s > 60) {
                items[id].needUpdate = true;
                items[id].needRequest = true;

                items[id].lastForceUpdate_s = tNow_s;
            }
        }
    }